

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toucs.c
# Opt level: O0

wchar_t charset_to_unicode(char **input,wchar_t *inlen,wchar_t *output,wchar_t outlen,
                          wchar_t charset,charset_state *state,wchar_t *errstr,wchar_t errlen)

{
  charset_spec_conflict *pcVar1;
  long lVar2;
  wchar_t *pwStack_68;
  wchar_t lenbefore;
  unicode_emit_param param;
  charset_state localstate;
  charset_spec *spec;
  charset_state *state_local;
  wchar_t charset_local;
  wchar_t outlen_local;
  wchar_t *output_local;
  wchar_t *inlen_local;
  char **input_local;
  
  pcVar1 = charset_find_spec(charset);
  param._8_8_ = errstr;
  param.errstr._0_4_ = errlen;
  param.errstr._4_4_ = 0;
  pwStack_68 = output;
  param.output._0_4_ = outlen;
  if (state == (charset_state *)0x0) {
    param.errlen = L'\0';
    param.stopped = L'\0';
  }
  else {
    param._24_8_ = state->s0;
  }
  while( true ) {
    if (*inlen < L'\x01') {
      return (wchar_t)((long)pwStack_68 - (long)output >> 2);
    }
    lVar2 = (long)pwStack_68 - (long)output;
    (*pcVar1->read)(pcVar1,(long)**input,(charset_state *)&param.errlen,unicode_emit,
                    &stack0xffffffffffffff98);
    if (param.errstr._4_4_ != 0) break;
    if (state != (charset_state *)0x0) {
      state->s0 = param._24_8_;
    }
    *input = *input + 1;
    *inlen = *inlen + L'\xffffffff';
  }
  return (wchar_t)(lVar2 >> 2);
}

Assistant:

int charset_to_unicode(const char **input, int *inlen,
                       wchar_t *output, int outlen,
                       int charset, charset_state *state,
                       const wchar_t *errstr, int errlen)
{
    charset_spec const *spec = charset_find_spec(charset);
    charset_state localstate;
    struct unicode_emit_param param;

    param.output = output;
    param.outlen = outlen;
    param.errstr = errstr;
    param.errlen = errlen;
    param.stopped = 0;

    if (!state) {
        localstate.s0 = 0;
    } else {
        localstate = *state;           /* structure copy */
    }

    while (*inlen > 0) {
        int lenbefore = param.output - output;
        spec->read(spec, (unsigned char)**input, &localstate,
                   unicode_emit, &param);
        if (param.stopped) {
            /*
             * The emit function has _tried_ to output some
             * characters, but ran up against the end of the
             * buffer. Leave immediately, and return what happened
             * _before_ attempting to process this character.
             */
            return lenbefore;
        }
        if (state)
            *state = localstate;   /* structure copy */
        (*input)++;
        (*inlen)--;
    }

    return param.output - output;
}